

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64_unit.cpp
# Opt level: O1

void anon_unknown.dwarf_3983::test_contains_range(void **param_1)

{
  _Bool _Var1;
  roaring64_bitmap_t *prVar2;
  
  prVar2 = roaring64_bitmap_create();
  _Var1 = roaring64_bitmap_contains_range(prVar2,1,10);
  _assert_true((ulong)!_Var1,"roaring64_bitmap_contains_range(r, 1, 10)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/roaring64_unit.cpp"
               ,0x152);
  roaring64_bitmap_free(prVar2);
  prVar2 = roaring64_bitmap_create();
  roaring64_bitmap_add_range(prVar2,1,10);
  _Var1 = roaring64_bitmap_contains_range(prVar2,1,1);
  _assert_true((ulong)_Var1,"roaring64_bitmap_contains_range(r, 1, 1)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/roaring64_unit.cpp"
               ,0x159);
  roaring64_bitmap_free(prVar2);
  prVar2 = roaring64_bitmap_create();
  roaring64_bitmap_add_range(prVar2,1,10);
  _Var1 = roaring64_bitmap_contains_range(prVar2,1,10);
  _assert_true((ulong)_Var1,"roaring64_bitmap_contains_range(r, 1, 10)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/roaring64_unit.cpp"
               ,0x160);
  _Var1 = roaring64_bitmap_contains_range(prVar2,1,0xb);
  _assert_true((ulong)!_Var1,"roaring64_bitmap_contains_range(r, 1, 11)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/roaring64_unit.cpp"
               ,0x161);
  roaring64_bitmap_free(prVar2);
  prVar2 = roaring64_bitmap_create();
  roaring64_bitmap_add_range(prVar2,1,0x1000a);
  _Var1 = roaring64_bitmap_contains_range(prVar2,1,0x1000a);
  _assert_true((ulong)_Var1,"roaring64_bitmap_contains_range(r, 1, (1 << 16) + 10)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/roaring64_unit.cpp"
               ,0x168);
  _Var1 = roaring64_bitmap_contains_range(prVar2,1,0xffff);
  _assert_true((ulong)_Var1,"roaring64_bitmap_contains_range(r, 1, (1 << 16) - 1)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/roaring64_unit.cpp"
               ,0x169);
  _Var1 = roaring64_bitmap_contains_range(prVar2,1,0x1000b);
  _assert_true((ulong)!_Var1,"roaring64_bitmap_contains_range(r, 1, (1 << 16) + 11)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/roaring64_unit.cpp"
               ,0x16a);
  _Var1 = roaring64_bitmap_contains_range(prVar2,0,0x1000a);
  _assert_true((ulong)!_Var1,"roaring64_bitmap_contains_range(r, 0, (1 << 16) + 10)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/roaring64_unit.cpp"
               ,0x16b);
  roaring64_bitmap_free(prVar2);
  prVar2 = roaring64_bitmap_create();
  roaring64_bitmap_add_range(prVar2,1,0x2000a);
  _Var1 = roaring64_bitmap_contains_range(prVar2,1,0x2000a);
  _assert_true((ulong)_Var1,"roaring64_bitmap_contains_range(r, 1, (2 << 16) + 10)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/roaring64_unit.cpp"
               ,0x172);
  _Var1 = roaring64_bitmap_contains_range(prVar2,1,0x2000b);
  _assert_true((ulong)!_Var1,"roaring64_bitmap_contains_range(r, 1, (2 << 16) + 11)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/roaring64_unit.cpp"
               ,0x173);
  roaring64_bitmap_free(prVar2);
  prVar2 = roaring64_bitmap_create();
  roaring64_bitmap_add_range(prVar2,1,0xffff);
  roaring64_bitmap_add_range(prVar2,0x20000,0x2ffff);
  _Var1 = roaring64_bitmap_contains_range(prVar2,1,0x2ffff);
  _assert_true((ulong)!_Var1,"roaring64_bitmap_contains_range(r, 1, (3 << 16) - 1)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/roaring64_unit.cpp"
               ,0x17b);
  roaring64_bitmap_free(prVar2);
  prVar2 = roaring64_bitmap_create();
  roaring64_bitmap_add_range(prVar2,1,0x10000);
  _Var1 = roaring64_bitmap_contains_range(prVar2,1,0x10001);
  _assert_true((ulong)!_Var1,"roaring64_bitmap_contains_range(r, 1, (1 << 16) + 1)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/roaring64_unit.cpp"
               ,0x182);
  roaring64_bitmap_free(prVar2);
  prVar2 = roaring64_bitmap_create();
  roaring64_bitmap_add(prVar2,0x10000);
  _Var1 = roaring64_bitmap_contains_range(prVar2,1,10);
  _assert_true((ulong)!_Var1,"roaring64_bitmap_contains_range(r, 1, 10)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/roaring64_unit.cpp"
               ,0x189);
  roaring64_bitmap_free(prVar2);
  prVar2 = roaring64_bitmap_create();
  roaring64_bitmap_add(prVar2,0x10000);
  _Var1 = roaring64_bitmap_contains_range(prVar2,0x20000,0x20001);
  _assert_true((ulong)!_Var1,"roaring64_bitmap_contains_range(r, 2 << 16, (2 << 16) + 1)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/roaring64_unit.cpp"
               ,0x191);
  roaring64_bitmap_free(prVar2);
  prVar2 = roaring64_bitmap_create();
  roaring64_bitmap_add(prVar2,0xffff);
  _Var1 = roaring64_bitmap_contains_range(prVar2,0xffff,0x10000);
  _assert_true((ulong)_Var1,"roaring64_bitmap_contains_range(r, (1 << 16) - 1, (1 << 16))",
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/roaring64_unit.cpp"
               ,0x199);
  _Var1 = roaring64_bitmap_contains_range(prVar2,0xffff,0x10001);
  _assert_true((ulong)!_Var1,"roaring64_bitmap_contains_range(r, (1 << 16) - 1, (1 << 16) + 1)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/roaring64_unit.cpp"
               ,0x19b);
  roaring64_bitmap_free(prVar2);
  prVar2 = roaring64_bitmap_create();
  roaring64_bitmap_add(prVar2,0x10000);
  _Var1 = roaring64_bitmap_contains_range(prVar2,0x10000,0x10001);
  _assert_true((ulong)_Var1,"roaring64_bitmap_contains_range(r, (1 << 16), (1 << 16) + 1)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/roaring64_unit.cpp"
               ,0x1a3);
  roaring64_bitmap_free(prVar2);
  prVar2 = roaring64_bitmap_create();
  _Var1 = roaring64_bitmap_contains_range(prVar2,0xfffffffffffefff5,0xffffffffffff0009);
  _assert_true((ulong)!_Var1,
               "roaring64_bitmap_contains_range( r, UINT64_MAX - 0x10000 - 10, UINT64_MAX - 0x10000 + 10)"
               ,
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/roaring64_unit.cpp"
               ,0x1aa);
  roaring64_bitmap_add_range(prVar2,0xfffffffffffefff5,0xffffffffffff0009);
  _Var1 = roaring64_bitmap_contains_range(prVar2,0xfffffffffffefff5,0xffffffffffff0009);
  _assert_true((ulong)_Var1,
               "roaring64_bitmap_contains_range( r, UINT64_MAX - 0x10000 - 10, UINT64_MAX - 0x10000 + 10)"
               ,
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/roaring64_unit.cpp"
               ,0x1ae);
  _Var1 = roaring64_bitmap_contains_range(prVar2,0xfffffffffffefff5,0xffffffffffffffff);
  _assert_true((ulong)!_Var1,
               "roaring64_bitmap_contains_range( r, UINT64_MAX - 0x10000 - 10, UINT64_MAX)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/roaring64_unit.cpp"
               ,0x1b0);
  roaring64_bitmap_free(prVar2);
  prVar2 = roaring64_bitmap_create();
  _Var1 = roaring64_bitmap_contains_range(prVar2,0xfffffffffffffffd,0xffffffffffffffff);
  _assert_true((ulong)!_Var1,"roaring64_bitmap_contains_range(r, UINT64_MAX - 2, UINT64_MAX)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/roaring64_unit.cpp"
               ,0x1b7);
  roaring64_bitmap_add(prVar2,0xfffffffffffffffe);
  _Var1 = roaring64_bitmap_contains_range(prVar2,0xfffffffffffffffd,0xffffffffffffffff);
  _assert_true((ulong)!_Var1,"roaring64_bitmap_contains_range(r, UINT64_MAX - 2, UINT64_MAX)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/roaring64_unit.cpp"
               ,0x1ba);
  roaring64_bitmap_add(prVar2,0xfffffffffffffffd);
  _Var1 = roaring64_bitmap_contains_range(prVar2,0xfffffffffffffffd,0xffffffffffffffff);
  _assert_true((ulong)_Var1,"roaring64_bitmap_contains_range(r, UINT64_MAX - 2, UINT64_MAX)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/roaring64_unit.cpp"
               ,0x1be);
  roaring64_bitmap_free(prVar2);
  return;
}

Assistant:

DEFINE_TEST(test_contains_range) {
    {
        // Empty bitmap.
        roaring64_bitmap_t* r = roaring64_bitmap_create();
        assert_false(roaring64_bitmap_contains_range(r, 1, 10));
        roaring64_bitmap_free(r);
    }
    {
        // Empty range.
        roaring64_bitmap_t* r = roaring64_bitmap_create();
        roaring64_bitmap_add_range(r, 1, 10);
        assert_true(roaring64_bitmap_contains_range(r, 1, 1));
        roaring64_bitmap_free(r);
    }
    {
        // Range within one container.
        roaring64_bitmap_t* r = roaring64_bitmap_create();
        roaring64_bitmap_add_range(r, 1, 10);
        assert_true(roaring64_bitmap_contains_range(r, 1, 10));
        assert_false(roaring64_bitmap_contains_range(r, 1, 11));
        roaring64_bitmap_free(r);
    }
    {
        // Range across two containers.
        roaring64_bitmap_t* r = roaring64_bitmap_create();
        roaring64_bitmap_add_range(r, 1, (1 << 16) + 10);
        assert_true(roaring64_bitmap_contains_range(r, 1, (1 << 16) + 10));
        assert_true(roaring64_bitmap_contains_range(r, 1, (1 << 16) - 1));
        assert_false(roaring64_bitmap_contains_range(r, 1, (1 << 16) + 11));
        assert_false(roaring64_bitmap_contains_range(r, 0, (1 << 16) + 10));
        roaring64_bitmap_free(r);
    }
    {
        // Range across three containers.
        roaring64_bitmap_t* r = roaring64_bitmap_create();
        roaring64_bitmap_add_range(r, 1, (2 << 16) + 10);
        assert_true(roaring64_bitmap_contains_range(r, 1, (2 << 16) + 10));
        assert_false(roaring64_bitmap_contains_range(r, 1, (2 << 16) + 11));
        roaring64_bitmap_free(r);
    }
    {
        // Container missing from range.
        roaring64_bitmap_t* r = roaring64_bitmap_create();
        roaring64_bitmap_add_range(r, 1, (1 << 16) - 1);
        roaring64_bitmap_add_range(r, (2 << 16), (3 << 16) - 1);
        assert_false(roaring64_bitmap_contains_range(r, 1, (3 << 16) - 1));
        roaring64_bitmap_free(r);
    }
    {
        // Range larger than bitmap.
        roaring64_bitmap_t* r = roaring64_bitmap_create();
        roaring64_bitmap_add_range(r, 1, 1 << 16);
        assert_false(roaring64_bitmap_contains_range(r, 1, (1 << 16) + 1));
        roaring64_bitmap_free(r);
    }
    {
        // Range entirely before the bitmap.
        roaring64_bitmap_t* r = roaring64_bitmap_create();
        roaring64_bitmap_add(r, 1 << 16);
        assert_false(roaring64_bitmap_contains_range(r, 1, 10));
        roaring64_bitmap_free(r);
    }
    {
        // Range entirely after the bitmap.
        roaring64_bitmap_t* r = roaring64_bitmap_create();
        roaring64_bitmap_add(r, 1 << 16);
        assert_false(
            roaring64_bitmap_contains_range(r, 2 << 16, (2 << 16) + 1));
        roaring64_bitmap_free(r);
    }
    {
        // Range exactly containing the last value in a container range.
        roaring64_bitmap_t* r = roaring64_bitmap_create();
        roaring64_bitmap_add(r, (1 << 16) - 1);
        assert_true(
            roaring64_bitmap_contains_range(r, (1 << 16) - 1, (1 << 16)));
        assert_false(
            roaring64_bitmap_contains_range(r, (1 << 16) - 1, (1 << 16) + 1));
        roaring64_bitmap_free(r);
    }
    {
        // Range exactly containing the first value in a container range.
        roaring64_bitmap_t* r = roaring64_bitmap_create();
        roaring64_bitmap_add(r, (1 << 16));
        assert_true(
            roaring64_bitmap_contains_range(r, (1 << 16), (1 << 16) + 1));
        roaring64_bitmap_free(r);
    }
    {
        // Range extending into the max container
        roaring64_bitmap_t* r = roaring64_bitmap_create();
        assert_false(roaring64_bitmap_contains_range(
            r, UINT64_MAX - 0x10000 - 10, UINT64_MAX - 0x10000 + 10));
        roaring64_bitmap_add_range(r, UINT64_MAX - 0x10000 - 10,
                                   UINT64_MAX - 0x10000 + 10);
        assert_true(roaring64_bitmap_contains_range(
            r, UINT64_MAX - 0x10000 - 10, UINT64_MAX - 0x10000 + 10));
        assert_false(roaring64_bitmap_contains_range(
            r, UINT64_MAX - 0x10000 - 10, UINT64_MAX));
        roaring64_bitmap_free(r);
    }
    {
        // Range fully inside max container
        roaring64_bitmap_t* r = roaring64_bitmap_create();
        assert_false(
            roaring64_bitmap_contains_range(r, UINT64_MAX - 2, UINT64_MAX));
        roaring64_bitmap_add(r, UINT64_MAX - 1);
        assert_false(
            roaring64_bitmap_contains_range(r, UINT64_MAX - 2, UINT64_MAX));
        roaring64_bitmap_add(r, UINT64_MAX - 2);
        // contains_range is exclusive, so UINT64_MAX is not required
        assert_true(
            roaring64_bitmap_contains_range(r, UINT64_MAX - 2, UINT64_MAX));
        roaring64_bitmap_free(r);
    }
}